

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_pairs(lua_State *L,MMS mm)

{
  ushort uVar1;
  uint uVar2;
  TValue *pTVar3;
  int iVar4;
  cTValue *tv;
  GCstr *pGVar5;
  CTState *cts;
  uint id;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pTVar3 = L->base;
  if ((L->top <= pTVar3) || ((pTVar3->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar1 = *(ushort *)((ulong)(pTVar3->u32).lo + 6);
  uVar2 = cts->tab[uVar1].info;
  id = (uint)uVar1;
  if ((uVar2 & 0xf0000000) == 0x20000000) {
    id = uVar2 & 0xffff;
  }
  tv = lj_ctype_meta(cts,id,mm);
  if (tv == (cTValue *)0x0) {
    pGVar5 = lj_ctype_repr(L,id,(GCstr *)0x0);
    lj_err_callerv(L,LJ_ERR_FFI_BADMM,pGVar5 + 1,
                   (ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x198 + (ulong)mm * 4) + 0x10);
  }
  iVar4 = lj_meta_tailcall(L,tv);
  return iVar4;
}

Assistant:

static int ffi_pairs(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkcdata(L, 1)->ctypeid;
  CType *ct = ctype_raw(cts, id);
  cTValue *tv;
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (!tv)
    lj_err_callerv(L, LJ_ERR_FFI_BADMM, strdata(lj_ctype_repr(L, id, NULL)),
		   strdata(mmname_str(G(L), mm)));
  return lj_meta_tailcall(L, tv);
}